

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_ordinaryFunction_directApply
          (sysbvm_context_t *context,sysbvm_tuple_t function,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  uint32_t uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_functionDefinition_t *definition;
  uint32_t primitiveNumber;
  sysbvm_function_t *functionObject;
  sysbvm_bitflags_t applicationFlags_local;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t function_local;
  sysbvm_context_t *context_local;
  
  if (*(long *)(function + 0x50) != 0) {
    sysbvm_primitiveTable_ensureIsComputed();
    uVar1 = sysbvm_tuple_uint32_decode(*(sysbvm_tuple_t *)(function + 0x50));
    if ((uVar1 != 0) && (uVar1 <= sysbvm_primitiveTableSize)) {
      sVar2 = sysbvm_ordinaryFunction_nativeApply
                        (context,function,sysbvm_primitiveTable[uVar1 - 1].entryPoint,argumentCount,
                         arguments,applicationFlags);
      return sVar2;
    }
  }
  if (*(long *)(function + 0x48) == 0) {
    sysbvm_error("Cannot apply a function without a proper definition.");
  }
  if (((sysbvm_function_useBytecodeInterpreter & 1U) == 0) ||
     (*(long *)(*(long *)(function + 0x48) + 0x80) == 0)) {
    context_local =
         (sysbvm_context_t *)
         sysbvm_interpreter_applyClosureASTFunction
                   (context,function,argumentCount,arguments,applicationFlags);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_bytecodeInterpreter_apply(context,function,argumentCount,arguments);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_directApply(sysbvm_context_t *context, sysbvm_tuple_t function, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;

    // Find the entry point in the primitive table.
    if(functionObject->primitiveTableIndex)
    {
        sysbvm_primitiveTable_ensureIsComputed();
        uint32_t primitiveNumber = sysbvm_tuple_uint32_decode(functionObject->primitiveTableIndex);
        if(primitiveNumber > 0 && primitiveNumber <= sysbvm_primitiveTableSize)
            return sysbvm_ordinaryFunction_nativeApply(context, function, sysbvm_primitiveTable[primitiveNumber - 1].entryPoint, argumentCount, arguments, applicationFlags);
    }
    
    if(!functionObject->definition)
        sysbvm_error("Cannot apply a function without a proper definition.");

    // Attempt to use the bytecode.
    sysbvm_functionDefinition_t *definition = (sysbvm_functionDefinition_t*)functionObject->definition;
    if(sysbvm_function_useBytecodeInterpreter && definition->bytecode)
        return sysbvm_bytecodeInterpreter_apply(context, function, argumentCount, arguments);
    
    return sysbvm_interpreter_applyClosureASTFunction(context, function, argumentCount, arguments, applicationFlags);
}